

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_parser_parseByteArrayExpression(sysbvm_context_t *context,sysbvm_parser_state_t *state)

{
  size_t startIndex;
  int iVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t sourcePosition;
  size_t endPosition;
  sysbvm_tuple_t elements;
  size_t startPosition;
  sysbvm_parser_state_t *state_local;
  sysbvm_context_t *context_local;
  
  iVar1 = sysbvm_parser_lookKindAt(state,0);
  if (iVar1 == 0x1e) {
    startIndex = state->tokenPosition;
    state->tokenPosition = state->tokenPosition + 1;
    sVar2 = sysbvm_parser_parseExpressionListUntil(context,state,SYSBVM_TOKEN_KIND_RBRACKET);
    iVar1 = sysbvm_parser_lookKindAt(state,0);
    if (iVar1 == 0xc) {
      state->tokenPosition = state->tokenPosition + 1;
      sourcePosition =
           sysbvm_parser_makeSourcePositionForTokenRange
                     (context,state->sourceCode,state->tokenSequence,startIndex,state->tokenPosition
                     );
      context_local =
           (sysbvm_context_t *)sysbvm_astMakeByteArrayNode_create(context,sourcePosition,sVar2);
    }
    else {
      sVar2 = sysbvm_parser_makeSourcePositionForParserState(context,state);
      context_local =
           (sysbvm_context_t *)
           sysbvm_astErrorNode_createWithCString(context,sVar2,"Expected a right bracket.");
    }
  }
  else {
    sVar2 = sysbvm_parser_makeSourcePositionForParserState(context,state);
    context_local =
         (sysbvm_context_t *)
         sysbvm_astErrorNode_createWithCString(context,sVar2,"Expected a byte array start.");
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_parser_parseByteArrayExpression(sysbvm_context_t *context, sysbvm_parser_state_t *state)
{
    if(sysbvm_parser_lookKindAt(state, 0) != SYSBVM_TOKEN_KIND_BYTE_ARRAY_START)
        return sysbvm_astErrorNode_createWithCString(context, sysbvm_parser_makeSourcePositionForParserState(context, state), "Expected a byte array start.");
    
    size_t startPosition = state->tokenPosition;
    ++state->tokenPosition;

    sysbvm_tuple_t elements = sysbvm_parser_parseExpressionListUntil(context, state, SYSBVM_TOKEN_KIND_RBRACKET);

    if(sysbvm_parser_lookKindAt(state, 0) != SYSBVM_TOKEN_KIND_RBRACKET)
        return sysbvm_astErrorNode_createWithCString(context, sysbvm_parser_makeSourcePositionForParserState(context, state), "Expected a right bracket.");
    
    ++state->tokenPosition;
    size_t endPosition = state->tokenPosition;

    return sysbvm_astMakeByteArrayNode_create(context, sysbvm_parser_makeSourcePositionForTokenRange(context, state->sourceCode, state->tokenSequence, startPosition, endPosition), elements);
}